

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O2

bool duckdb::DecimalCastOperation::
     TruncateExcessiveDecimals<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
               (DecimalCastData<duckdb::hugeint_t> *state)

{
  bool bVar1;
  idx_t i;
  ulong uVar2;
  hugeint_t mod;
  hugeint_t local_40;
  
  bVar1 = false;
  for (uVar2 = 0; uVar2 < state->excessive_decimals; uVar2 = uVar2 + 1) {
    hugeint_t::hugeint_t(&local_40,10);
    mod = hugeint_t::operator%(&state->result,&local_40);
    hugeint_t::hugeint_t(&local_40,5);
    bVar1 = hugeint_t::operator>=(&mod,&local_40);
    hugeint_t::hugeint_t(&local_40,10);
    hugeint_t::operator/=(&state->result,&local_40);
  }
  if ((bVar1 & state->exponent_type == POSITIVE) != 0) {
    RoundUpResult<duckdb::DecimalCastData<duckdb::hugeint_t>,false>(state);
  }
  state->decimal_count = state->scale;
  return true;
}

Assistant:

static bool TruncateExcessiveDecimals(T &state) {
		D_ASSERT(state.excessive_decimals);
		bool round_up = false;
		for (idx_t i = 0; i < state.excessive_decimals; i++) {
			auto mod = state.result % 10;
			round_up = NEGATIVE ? mod <= -5 : mod >= 5;
			state.result /= static_cast<typename T::StoreType>(10.0);
		}
		//! Only round up when exponents are involved
		if (state.exponent_type == ExponentType::POSITIVE && round_up) {
			RoundUpResult<T, NEGATIVE>(state);
		}
		D_ASSERT(state.decimal_count > state.scale);
		state.decimal_count = state.scale;
		return true;
	}